

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvtools::opt::anon_unknown_0::GetWordsFromNumericScalarOrVectorConstant
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConstantManager *const_mgr,Constant *c)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  ScalarConstant *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t val;
  uint32_t *puVar5;
  long *plVar6;
  Constant *extraout_RDX;
  Constant *extraout_RDX_00;
  Constant *c_00;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_in_words;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this = (ScalarConstant *)
         (*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_bucket_count)(const_mgr);
  if (this == (ScalarConstant *)0x0) {
    this = (ScalarConstant *)
           (*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_buckets)(const_mgr);
    if (this == (ScalarConstant *)0x0) {
      plVar6 = (long *)(*(code *)(const_mgr->ctx_->instr_to_block_)._M_h._M_rehash_policy.
                                 _M_next_resize)(const_mgr);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (plVar6 == (long *)0x0) {
        return __return_storage_ptr__;
      }
      auVar8 = (**(code **)(*plVar6 + 0xc0))(plVar6);
      c_00 = auVar8._8_8_;
      puVar7 = (undefined8 *)*auVar8._0_8_;
      puVar1 = (undefined8 *)auVar8._0_8_[1];
      if (puVar7 == puVar1) {
        return __return_storage_ptr__;
      }
      do {
        GetWordsFromNumericScalarOrVectorConstant(&local_40,(ConstantManager *)*puVar7,c_00);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish,
                   local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        c_00 = extraout_RDX;
        if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_40.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          c_00 = extraout_RDX_00;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
      return __return_storage_ptr__;
    }
    iVar2 = (*((this->super_Constant).type_)->_vptr_Type[10])();
    iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x24);
    uVar3 = iVar2 << 0x1d | iVar2 - 8U >> 3;
    if ((1 < uVar3) && (uVar3 != 3)) {
      if (uVar3 == 7) {
        val = analysis::Constant::GetU64((Constant *)this);
        ExtractInts(__return_storage_ptr__,val);
        return __return_storage_ptr__;
      }
      __assert_fail("width == 8 || width == 16 || width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x90,
                    "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarIntConstant(const analysis::IntConstant *)"
                   );
    }
  }
  else {
    iVar2 = (*((this->super_Constant).type_)->_vptr_Type[0xc])();
    iVar2 = *(int *)(CONCAT44(extraout_var,iVar2) + 0x24);
    if ((iVar2 != 0x10) && (iVar2 != 0x20)) {
      if (iVar2 == 0x40) {
        local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)analysis::Constant::GetDouble((Constant *)this);
        utils::FloatProxy<double>::GetWords(__return_storage_ptr__,(FloatProxy<double> *)&local_40);
        return __return_storage_ptr__;
      }
      __assert_fail("width == 16 || width == 32 || width == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x9e,
                    "std::vector<uint32_t> spvtools::opt::(anonymous namespace)::GetWordsFromScalarFloatConstant(const analysis::FloatConstant *)"
                   );
    }
  }
  uVar4 = analysis::ScalarConstant::GetU32BitValue(this);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar5 = (uint32_t *)operator_new(4);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = puVar5;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar5 + 1;
  *puVar5 = uVar4;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar5 + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWordsFromNumericScalarOrVectorConstant(
    analysis::ConstantManager* const_mgr, const analysis::Constant* c) {
  if (const auto* float_constant = c->AsFloatConstant()) {
    return GetWordsFromScalarFloatConstant(float_constant);
  } else if (const auto* int_constant = c->AsIntConstant()) {
    return GetWordsFromScalarIntConstant(int_constant);
  } else if (const auto* vec_constant = c->AsVectorConstant()) {
    std::vector<uint32_t> words;
    for (const auto* comp : vec_constant->GetComponents()) {
      auto comp_in_words =
          GetWordsFromNumericScalarOrVectorConstant(const_mgr, comp);
      words.insert(words.end(), comp_in_words.begin(), comp_in_words.end());
    }
    return words;
  }
  return {};
}